

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool CastToBool(valtype *vch)

{
  pointer puVar1;
  bool bVar2;
  byte bVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  long in_FS_OFFSET;
  
  cVar7 = (char)vch;
  puVar4 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (puVar4[uVar5] != '\0') {
        cVar7 = -puVar4[uVar5];
        puVar4 = (pointer)0x1;
        bVar3 = 1;
        goto LAB_00413066;
      }
      bVar2 = uVar6 < (ulong)((long)puVar1 - (long)puVar4);
      cVar7 = '\0';
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  bVar3 = 0;
LAB_00413066:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)(bVar3 & (byte)puVar4);
  }
  __stack_chk_fail(cVar7);
}

Assistant:

bool CastToBool(const valtype& vch)
{
    for (unsigned int i = 0; i < vch.size(); i++)
    {
        if (vch[i] != 0)
        {
            // Can be negative zero
            if (i == vch.size()-1 && vch[i] == 0x80)
                return false;
            return true;
        }
    }
    return false;
}